

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

QAccessibleInterface * __thiscall QAccessibleTree::cellAt(QAccessibleTree *this,int row,int column)

{
  int iVar1;
  QObject *object;
  QTreeView *pQVar2;
  QAccessibleInterface *pQVar3;
  long in_FS_OFFSET;
  char local_68 [24];
  char *local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  indexFromLogical((QModelIndex *)&local_48,this,row,column);
  if ((((int)local_48 < 0) || ((long)local_48 < 0)) || (local_38.ptr == (QAbstractItemModel *)0x0))
  {
    local_68[0] = '\x02';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[0x14] = '\0';
    local_68[0x15] = '\0';
    local_68[0x16] = '\0';
    local_68[0x17] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    local_68[8] = '\0';
    local_68[9] = '\0';
    local_68[10] = '\0';
    local_68[0xb] = '\0';
    local_68[0xc] = '\0';
    local_68[0xd] = '\0';
    local_68[0xe] = '\0';
    local_68[0xf] = '\0';
    local_68[0x10] = '\0';
    local_68[0x11] = '\0';
    local_68[0x12] = '\0';
    local_68[0x13] = '\0';
    local_50 = "default";
    pQVar3 = (QAccessibleInterface *)0x0;
    QMessageLogger::warning
              (local_68,"Requested invalid tree cell: %d %d",(ulong)(uint)row,(ulong)(uint)column);
  }
  else {
    object = (QObject *)QAccessibleTable::view(&this->super_QAccessibleTable);
    pQVar2 = QtPrivate::qobject_cast_helper<QTreeView_const*,QObject>(object);
    iVar1 = QTreeViewPrivate::accessibleTable2Index
                      (*(QTreeViewPrivate **)
                        &(pQVar2->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget.field_0x8,(QModelIndex *)&local_48);
    pQVar3 = (QAccessibleInterface *)
             (**(code **)(*(long *)&this->super_QAccessibleTable + 0x100))(this,iVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleTree::cellAt(int row, int column) const
{
    QModelIndex index = indexFromLogical(row, column);
    if (Q_UNLIKELY(!index.isValid())) {
        qWarning("Requested invalid tree cell: %d %d", row, column);
        return nullptr;
    }
    const QTreeView *treeView = qobject_cast<const QTreeView*>(view());
    Q_ASSERT(treeView);
    int logicalIndex = treeView->d_func()->accessibleTable2Index(index);

    return child(logicalIndex);
}